

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_local_cell(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  uint uVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  
  pRVar2 = ref_grid->node;
  *allowed = 0;
  pRVar3 = ref_grid->cell[3];
  iVar7 = -1;
  uVar8 = 0xffffffff;
  if (-1 < node0) {
    pRVar4 = pRVar3->ref_adj;
    uVar8 = 0xffffffff;
    iVar7 = -1;
    if (node0 < pRVar4->nnode) {
      uVar1 = pRVar4->first[(uint)node0];
      uVar8 = 0xffffffff;
      iVar7 = -1;
      if ((long)(int)uVar1 != -1) {
        iVar7 = pRVar4->item[(int)uVar1].ref;
        uVar8 = (ulong)uVar1;
      }
    }
  }
  do {
    if ((int)uVar8 == -1) {
      *allowed = 1;
      return 0;
    }
    uVar1 = pRVar3->node_per;
    uVar9 = 0;
    uVar10 = 0;
    if (0 < (int)uVar1) {
      uVar10 = uVar1;
    }
    for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      lVar11 = (long)pRVar3->size_per * (long)iVar7;
      if (pRVar3->c2n[(int)((int)lVar11 + uVar9)] == node1) {
        uVar12 = 0;
        while (uVar1 != uVar12) {
          lVar6 = lVar11 + uVar12;
          uVar12 = uVar12 + 1;
          if (pRVar2->ref_mpi->id != pRVar2->part[pRVar3->c2n[lVar6]]) {
            return 0;
          }
        }
      }
    }
    pRVar5 = pRVar3->ref_adj->item;
    uVar8 = (ulong)pRVar5[(int)uVar8].next;
    iVar7 = -1;
    if (uVar8 != 0xffffffffffffffff) {
      iVar7 = pRVar5[uVar8].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_swap_local_cell(REF_GRID ref_grid, REF_INT node0,
                                       REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, search_node, test_node;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (search_node = 0; search_node < ref_cell_node_per(ref_cell);
         search_node++) {
      if (node1 == ref_cell_c2n(ref_cell, search_node, cell)) {
        for (test_node = 0; test_node < ref_cell_node_per(ref_cell);
             test_node++) {
          if (!ref_node_owned(ref_node,
                              ref_cell_c2n(ref_cell, test_node, cell))) {
            return REF_SUCCESS;
          }
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}